

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Expression * __thiscall Parser::parseExpression(Parser *this)

{
  FILE *pFVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  int iVar4;
  FILE *p1;
  const_iterator cVar5;
  iterator iVar6;
  Operate *o;
  FILE *p2;
  Expression *this_00;
  string p2Type;
  string p1Type;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  key_type local_f0;
  key_type local_d0;
  undefined8 local_b0 [4];
  key_type local_90;
  key_type local_70;
  undefined8 local_50 [4];
  
  p1 = (FILE *)parsePrimaryExpression(this);
  (**(code **)(*(long *)p1 + 0x18))(&local_130,p1);
  p2 = _stderr;
  if (local_130._M_string_length == 0) {
    (*(code *)**(undefined8 **)p1)(&local_d0,p1);
    parseExpression();
LAB_0011756e:
    p1 = _stderr;
    (*(code *)**(undefined8 **)p2)(&local_f0,p2);
    parseExpression();
  }
  else {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_130,"STRING");
    if ((iVar4 == 0) ||
       (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_130,"CHAR"), iVar4 == 0)) {
      (*(code *)**(undefined8 **)p1)(&local_d0,p1);
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
              ::find(&(this->var_table)._M_t,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar5._M_node != &(this->var_table)._M_t._M_impl.super__Rb_tree_header)
      {
        (*(code *)**(undefined8 **)p1)(&local_70,p1);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
                ::find(&(this->var_table)._M_t,&local_70);
        (*(code *)**(undefined8 **)iVar6._M_node[2]._M_left)(&local_d0);
        parseExpression();
      }
    }
    Scanner::toUpper(&local_150,&local_130);
    parseExpression();
    o = parseOperator(this);
    p2 = (FILE *)parsePrimaryExpression(this);
    (**(code **)(*(long *)p2 + 0x18))(&local_150,p2);
    if (local_150._M_string_length == 0) goto LAB_0011756e;
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_150,"STRING");
    if ((iVar4 == 0) ||
       (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_150,"CHAR"), iVar4 == 0)) {
      (*(code *)**(undefined8 **)p2)(&local_f0,p2);
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
              ::find(&(this->var_table)._M_t,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar5._M_node != &(this->var_table)._M_t._M_impl.super__Rb_tree_header)
      {
        (*(code *)**(undefined8 **)p2)(&local_90,p2);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>_>_>
                ::find(&(this->var_table)._M_t,&local_90);
        (*(code *)**(undefined8 **)iVar6._M_node[2]._M_left)(&local_f0);
        parseExpression();
      }
    }
    Scanner::toUpper(&local_110,&local_150);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_150,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (((local_150._M_string_length == local_130._M_string_length) &&
        ((local_150._M_string_length == 0 ||
         (iVar4 = bcmp(local_150._M_dataplus._M_p,local_130._M_dataplus._M_p,
                       local_150._M_string_length), iVar4 == 0)))) &&
       ((iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(&local_130,"STRING"), iVar4 == 0 ||
        (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(&local_130,"CHAR"), iVar4 == 0)))) {
      (**(o->super_Terminal).super_AST._vptr_AST)(&local_110,o);
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_110,"+");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      pFVar1 = _stderr;
      if (iVar4 != 0) {
        (**(o->super_Terminal).super_AST._vptr_AST)(&local_110,o);
        (*(code *)**(undefined8 **)p1)(local_b0,p1);
        (*(code *)**(undefined8 **)p2)(local_50,p2);
        fprintf(pFVar1,
                "\x1b[31m\nFATAL: Invalid Operator \'%s\' for Strings \'%s\' and \'%s\'\n\x1b[0m",
                local_110._M_dataplus._M_p,local_b0[0],local_50[0]);
        std::__cxx11::string::~string((string *)local_50);
        goto LAB_001175f2;
      }
    }
    _Var3._M_p = local_130._M_dataplus._M_p;
    _Var2._M_p = local_150._M_dataplus._M_p;
    if ((local_130._M_string_length == local_150._M_string_length) &&
       ((local_150._M_string_length == 0 ||
        (iVar4 = bcmp(local_130._M_dataplus._M_p,local_150._M_dataplus._M_p,
                      local_150._M_string_length), iVar4 == 0)))) {
      fprintf(_stdout,
              "\x1b[32m\t = PrimaryExpression1 [Type \'%s\'] matches PrimaryExpression2 [Type \'%s\']\n\x1b[0m"
              ,_Var3._M_p,_Var2._M_p);
      this_00 = (Expression *)operator_new(0x20);
      Expression::Expression(this_00,(PrimaryExpression *)p1,(PrimaryExpression *)p2,o);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      return this_00;
    }
  }
  pFVar1 = _stderr;
  (*(code *)**(undefined8 **)p1)(&local_110,p1);
  (*(code *)**(undefined8 **)p2)(local_b0,p2);
  fprintf(pFVar1,
          "\x1b[31m\nFATAL: Incompatible types: \nP1: %s [Type \'%s\']\nP2: %s [Type \'%s\']\n\x1b[0m"
          ,local_110._M_dataplus._M_p,local_130._M_dataplus._M_p,local_b0[0],
          local_150._M_dataplus._M_p);
LAB_001175f2:
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_110);
  exit(1);
}

Assistant:

Expression *Parser::parseExpression() {
    // parse primary expression
    PrimaryExpression *p1 = parsePrimaryExpression();
    std::string p1Type = p1->getType();
    if (p1Type.length() == 0) {
        fprintf(stderr, ANSI_COLOR_RED "\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1->describe().data(), p1Type.data());
        exit(1);
    }
    // Check if variable/expression defined in vartable, then change data type appropriately
    if (p1Type == "STRING" || p1Type == "CHAR") {
        if (checkVarExists(p1->describe())) {
            p1Type = var_table.find(p1->describe())->second.type->describe();
        }
    }
    p1Type = Scanner::toUpper(p1Type);

    // parse operator
    Operate *o1 = parseOperator();

    // parse primary expression
    PrimaryExpression *p2 = parsePrimaryExpression();
    std::string p2Type = p2->getType();
    if (p2Type.length() == 0) {
        fprintf(stderr, ANSI_COLOR_RED "\nFATAL: Unknown type for variable: \'%s\' [Type \'%s\']\n" ANSI_COLOR_RESET,
                p2->describe().data(), p2Type.data());
        exit(1);
    }
    // Check if variable/expression defined in vartable, then change data type appropriately
    if (p2Type == "STRING" || p2Type == "CHAR") {
        if (checkVarExists(p2->describe())) {
            p2Type = var_table.find(p2->describe())->second.type->describe();
        }
    }
    p2Type = Scanner::toUpper(p2Type);

    // Check + is used with strings or chars
    if (p2Type == p1Type && (p1Type == "STRING" || p1Type == "CHAR") && o1->describe() != "+") {
        fprintf(stderr,
                ANSI_COLOR_RED "\nFATAL: Invalid Operator \'%s\' for Strings \'%s\' and \'%s\'\n" ANSI_COLOR_RESET,
                o1->describe().data(), p1->describe().data(), p2->describe().data());
        exit(1);
    }

    // Check incompatible types
    if (p1Type != p2Type) {
        fprintf(stderr,
                ANSI_COLOR_RED "\nFATAL: Incompatible types: \nP1: %s [Type \'%s\']\nP2: %s [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1->describe().data(), p1Type.data(), p2->describe().data(), p2Type.data());
        exit(1);
    }

    if (_VERBOSITY >= 3) {
        fprintf(stdout,
                ANSI_COLOR_GREEN "\t = PrimaryExpression1 [Type \'%s\'] matches PrimaryExpression2 [Type \'%s\']\n" ANSI_COLOR_RESET,
                p1Type.data(), p2Type.data());
    }

    // Build Expression
    return new Expression(p1, p2, o1);
}